

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void __thiscall uWS::Group<true>::addWebSocket(Group<true> *this,uv_poll_t *webSocket)

{
  SocketData *data;
  SocketData *nextData;
  uv_poll_t *webSocket_local;
  Group<true> *this_local;
  
  if (this->webSocketHead != (uv_poll_t *)0x0) {
    *(uv_poll_t **)((long)this->webSocketHead->data + 0x38) = webSocket;
    *(uv_poll_t **)((long)webSocket->data + 0x30) = this->webSocketHead;
  }
  this->webSocketHead = webSocket;
  return;
}

Assistant:

void Group<isServer>::addWebSocket(uv_poll_t *webSocket) {
    if (webSocketHead) {
        uS::SocketData *nextData = (uS::SocketData *) webSocketHead->data;
        nextData->prev = webSocket;
        uS::SocketData *data = (uS::SocketData *) webSocket->data;
        data->next = webSocketHead;
    }
    webSocketHead = webSocket;
}